

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,bool is_setter_argument,bool force_present,
          bool singular_if_not_packed,BytesMode bytes_mode)

{
  bool bVar1;
  Type TVar2;
  LogMessage *other;
  BytesMode bytes_mode_00;
  string *psVar3;
  undefined3 in_stack_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  byte local_d9;
  undefined1 local_d8 [7];
  bool is_null_or_undefined;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_76;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  byte local_23;
  byte local_22;
  byte local_21;
  bool singular_if_not_packed_local;
  bool force_present_local;
  GeneratorOptions *pGStack_20;
  bool is_setter_argument_local;
  FieldDescriptor *field_local;
  GeneratorOptions *options_local;
  string *jstype;
  
  local_21 = (byte)field & 1;
  local_61 = 0;
  psVar3 = __return_storage_ptr__;
  local_23 = force_present;
  local_22 = is_setter_argument;
  pGStack_20 = options;
  field_local = (FieldDescriptor *)this;
  options_local = (GeneratorOptions *)__return_storage_ptr__;
  if ((((ulong)field & 1) != 0) && (is_setter_argument)) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x3db);
    local_61 = 1;
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: !(is_setter_argument && force_present): ");
    internal::LogFinisher::operator=(local_75,other);
  }
  bytes_mode_00 = (BytesMode)psVar3;
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  local_76 = 0;
  JSTypeName_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)field_local,pGStack_20,
             (FieldDescriptor *)(ulong)_singular_if_not_packed,bytes_mode_00);
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)pGStack_20);
  if ((bVar1) &&
     ((bVar1 = FieldDescriptor::is_packed((FieldDescriptor *)pGStack_20), bVar1 ||
      ((local_23 & 1) == 0)))) {
    TVar2 = FieldDescriptor::type((FieldDescriptor *)pGStack_20);
    if ((TVar2 == TYPE_BYTES) && (_singular_if_not_packed == 0)) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,"(Array<!Uint8Array>|Array<string>)");
    }
    else {
      bVar1 = anon_unknown_0::IsPrimitive(__return_storage_ptr__);
      if (!bVar1) {
        std::operator+(&local_98,"!",__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     "Array.<",__return_storage_ptr__);
      std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     ">");
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)local_d8);
    }
  }
  local_d9 = 0;
  if ((local_21 & 1) == 0) {
    if (((local_22 & 1) == 0) &&
       (bVar1 = anon_unknown_0::DeclaredReturnTypeIsNullable
                          ((GeneratorOptions *)field_local,(FieldDescriptor *)pGStack_20), bVar1)) {
      std::operator+(&local_120,"?",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      local_d9 = 1;
    }
  }
  else {
    bVar1 = anon_unknown_0::SetterAcceptsNull
                      ((GeneratorOptions *)field_local,(FieldDescriptor *)pGStack_20);
    if (bVar1) {
      std::operator+(&local_100,"?",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      local_d9 = 1;
    }
    bVar1 = anon_unknown_0::SetterAcceptsUndefined
                      ((GeneratorOptions *)field_local,(FieldDescriptor *)pGStack_20);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"|undefined");
      local_d9 = 1;
    }
  }
  if (((local_d9 & 1) == 0) && (bVar1 = anon_unknown_0::IsPrimitive(__return_storage_ptr__), !bVar1)
     ) {
    std::operator+(&local_140,"!",__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
  }
  return __return_storage_ptr__;
}

Assistant:

string JSFieldTypeAnnotation(const GeneratorOptions& options,
                             const FieldDescriptor* field,
                             bool is_setter_argument,
                             bool force_present,
                             bool singular_if_not_packed,
                             BytesMode bytes_mode = BYTES_DEFAULT) {
  GOOGLE_CHECK(!(is_setter_argument && force_present));
  string jstype = JSTypeName(options, field, bytes_mode);

  if (field->is_repeated() &&
      (field->is_packed() || !singular_if_not_packed)) {
    if (field->type() == FieldDescriptor::TYPE_BYTES &&
        bytes_mode == BYTES_DEFAULT) {
      jstype = "(Array<!Uint8Array>|Array<string>)";
    } else {
      if (!IsPrimitive(jstype)) {
        jstype = "!" + jstype;
      }
      jstype = "Array.<" + jstype + ">";
    }
  }

  bool is_null_or_undefined = false;

  if (is_setter_argument) {
    if (SetterAcceptsNull(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }

    if (SetterAcceptsUndefined(options, field)) {
      jstype += "|undefined";
      is_null_or_undefined = true;
    }
  } else if (force_present) {
    // Don't add null or undefined.
  } else {
    if (DeclaredReturnTypeIsNullable(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }
  }

  if (!is_null_or_undefined && !IsPrimitive(jstype)) {
    jstype = "!" + jstype;
  }

  return jstype;
}